

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O1

void __thiscall
JumpBasicOverride::buildLabels
          (JumpBasicOverride *this,Funcdata *fd,
          vector<Address,_std::allocator<Address>_> *addresstable,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *label,JumpModel *orig)

{
  iterator iVar1;
  bool bVar2;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  uintb addr;
  uintb local_58;
  string local_50;
  
  puVar3 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      local_58 = JumpBasic::backup2Switch
                           (fd,puVar3[uVar4],(this->super_JumpBasic).normalvn,
                            (this->super_JumpBasic).switchvn);
      iVar1._M_current =
           (label->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (label->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)label,iVar1,&local_58);
      }
      else {
        *iVar1._M_current = local_58;
        (label->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      if ((ulong)((long)(addresstable->super__Vector_base<Address,_std::allocator<Address>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(addresstable->super__Vector_base<Address,_std::allocator<Address>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 4) <=
          (ulong)((long)(label->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(label->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3)) break;
      puVar3 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar5 < (ulong)((long)(this->values).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  if ((ulong)((long)(label->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(label->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) <
      (ulong)((long)(addresstable->super__Vector_base<Address,_std::allocator<Address>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(addresstable->super__Vector_base<Address,_std::allocator<Address>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 4)) {
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Bad switch case","");
      Funcdata::warning(fd,&local_50,
                        (Address *)
                        (((long)(label->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(label->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start) * 2 +
                        (long)(addresstable->super__Vector_base<Address,_std::allocator<Address>_>).
                              _M_impl.super__Vector_impl_data._M_start));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      local_50._M_dataplus._M_p = (pointer)0xbad1abe1;
      iVar1._M_current =
           (label->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (label->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (label,iVar1,(unsigned_long *)&local_50);
      }
      else {
        *iVar1._M_current = 0xbad1abe1;
        (label->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
    } while ((ulong)((long)(label->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(label->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3) <
             (ulong)((long)(addresstable->super__Vector_base<Address,_std::allocator<Address>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(addresstable->super__Vector_base<Address,_std::allocator<Address>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 4));
  }
  return;
}

Assistant:

void JumpBasicOverride::buildLabels(Funcdata *fd,vector<Address> &addresstable,vector<uintb> &label,const JumpModel *orig) const

{
  uintb addr;

  for(uint4 i=0;i<values.size();++i) {
    try {
      addr = backup2Switch(fd,values[i],normalvn,switchvn);
    } catch(EvaluationError &err) {
      addr = 0xBAD1ABE1;
    }
    label.push_back(addr);
    if (label.size() >= addresstable.size()) break; // This should never happen
  }

  while(label.size() < addresstable.size()) {
    fd->warning("Bad switch case",addresstable[label.size()]); // This should never happen
    label.push_back(0xBAD1ABE1);
  }
}